

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall PClassActor::DeriveData(PClassActor *this,PClass *newclass)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  PType *pPVar4;
  PSymbolTable *this_00;
  
  bVar3 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (!bVar3) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/info.cpp"
                  ,0x133,"virtual void PClassActor::DeriveData(PClass *)");
  }
  *(uint8_t *)
   ((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject + 0x1d) = this->DefaultStateUsage;
  FString::operator=((FString *)
                     ((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.Symbols.Symbols + 0x10),&this->Obituary
                    );
  FString::operator=((FString *)
                     &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.MemberOnly,&this->HitObituary);
  dVar1 = this->BurnHeight;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  mDescriptiveName.Chars = (char *)this->DeathHeight;
  *(double *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    loadOp = dVar1;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    Conversions.Array = (this->BloodColor).field_0;
  *(undefined8 *)
   ((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.Conversions.Array + 4) = *(undefined8 *)&this->GibHealth;
  pPVar4 = (PType *)this->RDFactor;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  PredType = (PType *)this->FastSpeed;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  VisitNext = pPVar4;
  *(double *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    PredConv = this->CameraHeight;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.Outer =
       *(PTypeBase **)&this->HowlSound;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index =
       (this->BloodType2).Index;
  *(int *)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.field_0xa4 =
       (this->BloodType3).Index;
  *(FIntCVar **)&newclass[1].super_PNativeStruct.super_PStruct.HasNativeFields = this->distancecheck
  ;
  newclass[1].super_PNativeStruct.super_PStruct.Fields.Array = (PField **)this->DropItems;
  *(bool *)&newclass[1].SpecialInits.Array = this->DontHurtShooter;
  uVar2 = *(undefined8 *)&this->MeleeDamage;
  *(undefined8 *)((long)&newclass[1].SpecialInits.Array + 4) = *(undefined8 *)&this->ExplosionRadius
  ;
  *(undefined8 *)&newclass[1].SpecialInits.Count = uVar2;
  *(int *)((long)&newclass[1].ParentClass + 4) = (this->MissileName).Index;
  newclass[1].Pointers = (size_t *)this->MissileHeight;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
            ((TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *)
             &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols.Symbols,&this->VisibleToPlayerClass);
  if (this->DamageFactors != (DmgFactors *)0x0) {
    pPVar4 = (PType *)operator_new(0x18);
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::TMap
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)pPVar4);
    newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    HashNext = pPVar4;
    TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::operator=
              ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)pPVar4,
               &this->DamageFactors->
                super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>);
  }
  if (this->PainChances != (PainChanceList *)0x0) {
    this_00 = (PSymbolTable *)operator_new(0x18);
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_00);
    newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    Symbols.ParentSymbolTable = this_00;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_00,this->PainChances
              );
    return;
  }
  return;
}

Assistant:

void PClassActor::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassActor)));
	PClassActor *newa = static_cast<PClassActor *>(newclass);

	newa->DefaultStateUsage = DefaultStateUsage;
	newa->Obituary = Obituary;
	newa->HitObituary = HitObituary;
	newa->DeathHeight = DeathHeight;
	newa->BurnHeight = BurnHeight;
	newa->BloodColor = BloodColor;
	newa->GibHealth = GibHealth;
	newa->WoundHealth = WoundHealth;
	newa->FastSpeed = FastSpeed;
	newa->RDFactor = RDFactor;
	newa->CameraHeight = CameraHeight;
	newa->HowlSound = HowlSound;
	newa->BloodType = BloodType;
	newa->BloodType2 = BloodType2;
	newa->BloodType3 = BloodType3;
	newa->distancecheck = distancecheck;

	newa->DropItems = DropItems;

	newa->DontHurtShooter = DontHurtShooter;
	newa->ExplosionRadius = ExplosionRadius;
	newa->ExplosionDamage = ExplosionDamage;
	newa->MeleeDamage = MeleeDamage;
	newa->MeleeSound = MeleeSound;
	newa->MissileName = MissileName;
	newa->MissileHeight = MissileHeight;

	newa->VisibleToPlayerClass = VisibleToPlayerClass;

	if (DamageFactors != NULL)
	{
		// copy damage factors from parent
		newa->DamageFactors = new DmgFactors;
		*newa->DamageFactors = *DamageFactors;
	}
	if (PainChances != NULL)
	{
		// copy pain chances from parent
		newa->PainChances = new PainChanceList;
		*newa->PainChances = *PainChances;
	}

}